

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

bool __thiscall
Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::operator==
          (Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *this,
          Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *o)

{
  MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar1;
  MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  lVar3 = (long)this->_cursor - (long)this->_stack;
  if (lVar3 == (long)o->_cursor - (long)o->_stack) {
    bVar5 = this->_cursor == this->_stack;
    if (!bVar5) {
      lVar4 = (lVar3 >> 2) * 0x6db6db6db6db6db7;
      lVar3 = 0;
      do {
        pMVar1 = this->_stack;
        pMVar2 = o->_stack;
        bVar5 = Kernel::operator==((PolyNf *)
                                   ((pMVar1->term).super_PolyNfSuper._inner.
                                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                    .
                                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                    ._content + lVar3 + -1),
                                   (PolyNf *)
                                   ((pMVar2->term).super_PolyNfSuper._inner.
                                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                    .
                                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                    ._content + lVar3 + -1));
        if (!bVar5) {
          return false;
        }
        if (*(int *)((long)(&pMVar1->term + 1) + lVar3) !=
            *(int *)((long)(&pMVar2->term + 1) + lVar3)) {
          return false;
        }
        lVar3 = lVar3 + 0x1c;
        lVar4 = lVar4 + -1;
        bVar5 = lVar4 == 0;
      } while (!bVar5);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool operator==(const Stack& o) const
  {
    if(size()!=o.size()) {
      return false;
    }
    size_t sz = size();
    for(size_t i=0; i!=sz; ++i) {
      if((*this)[i]!=o[i]) {
	return false;
      }
    }
    return true;
  }